

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O2

void __thiscall SummedArea_NonCellAligned_Test::TestBody(SummedArea_NonCellAligned_Test *this)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  enable_if_t<std::is_integral_v<int>,_int> eVar3;
  allocator_type allocator;
  float *pfVar4;
  Allocator alloc;
  long lVar5;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *args_1;
  char *message;
  int x;
  int x_00;
  int y;
  int iVar6;
  undefined1 auVar7 [16];
  float fVar8;
  Float FVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float local_e8;
  Float sampledResult;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  AssertionResult gtest_ar;
  Bounds2f b;
  Array2D<float> v;
  AssertHelper local_90;
  Hammersley2DIter __begin2;
  double s;
  SummedAreaTable sat;
  RNG rng;
  undefined1 extraout_var [56];
  
  rng.state = 0x853c49e6748fea9b;
  rng.inc = 0xda3e39cb94b95bdb;
  for (lVar5 = 0; lVar5 != 0x30; lVar5 = lVar5 + 8) {
    uVar1 = *(undefined8 *)((long)&DAT_0052d9d0 + lVar5);
    allocator.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Array2D<float>::Array2D(&v,(int)uVar1,(int)((ulong)uVar1 >> 0x20),allocator);
    for (iVar6 = 0;
        iVar6 < v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y -
                v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y; iVar6 = iVar6 + 1) {
      for (x_00 = 0;
          x_00 < v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x -
                 v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x; x_00 = x_00 + 1) {
        eVar3 = pbrt::RNG::Uniform<int>(&rng,0x20);
        pfVar4 = pbrt::Array2D<float>::operator()(&v,x_00,iVar6);
        *pfVar4 = (float)eVar3;
      }
    }
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::SummedAreaTable::SummedAreaTable(&sat,&v,alloc);
    fVar8 = pbrt::RNG::Uniform<float>(&rng);
    __begin2.super_IndexingIterator<pbrt::detail::Hammersley2DIter>.n =
         (int)pbrt::RNG::Uniform<float>(&rng);
    __begin2.super_IndexingIterator<pbrt::detail::Hammersley2DIter>.i = (int)fVar8;
    fVar8 = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._4_4_ = pbrt::RNG::Uniform<float>(&rng);
    gtest_ar._0_4_ = fVar8;
    pbrt::Bounds2<float>::Bounds2(&b,(Point2<float> *)&__begin2,(Point2<float> *)&gtest_ar);
    __begin2.super_IndexingIterator<pbrt::detail::Hammersley2DIter>.i = 0;
    __begin2.super_IndexingIterator<pbrt::detail::Hammersley2DIter>.n = 100000;
    iVar6 = 0;
    local_e8 = 0.0;
    while (iVar6 != 100000) {
      auVar13._0_8_ = pbrt::detail::Hammersley2DIter::operator*(&__begin2);
      auVar13._8_56_ = extraout_var;
      auVar18._8_4_ = 0x3f800000;
      auVar18._0_8_ = 0x3f8000003f800000;
      auVar18._12_4_ = 0x3f800000;
      auVar14._8_8_ = 0;
      auVar14._0_4_ = b.pMin.super_Tuple2<pbrt::Point2,_float>.x;
      auVar14._4_4_ = b.pMin.super_Tuple2<pbrt::Point2,_float>.y;
      auVar7 = vsubps_avx(auVar18,auVar13._0_16_);
      auVar10._0_4_ = auVar13._0_4_ * b.pMax.super_Tuple2<pbrt::Point2,_float>.x;
      auVar10._4_4_ = auVar13._4_4_ * b.pMax.super_Tuple2<pbrt::Point2,_float>.y;
      auVar10._8_4_ = extraout_var._0_4_ * 0.0;
      auVar10._12_4_ = extraout_var._4_4_ * 0.0;
      auVar17._4_4_ = v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.y;
      auVar17._0_4_ = v.extent.pMin.super_Tuple2<pbrt::Point2,_int>.x;
      auVar2 = vfmadd231ps_fma(auVar10,auVar14,auVar7);
      auVar15._4_4_ = v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
      auVar15._0_4_ = v.extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
      auVar15._8_8_ = 0;
      auVar17._8_8_ = 0;
      auVar16 = vpsubd_avx(auVar15,auVar17);
      auVar7 = vcvtdq2ps_avx(auVar16);
      auVar11._0_4_ = (int)(auVar2._0_4_ * auVar7._0_4_);
      auVar11._4_4_ = (int)(auVar2._4_4_ * auVar7._4_4_);
      auVar11._8_4_ = (int)(auVar2._8_4_ * auVar7._8_4_);
      auVar11._12_4_ = (int)(auVar2._12_4_ * auVar7._12_4_);
      auVar2 = vpsubd_avx(auVar11,auVar17);
      auVar7 = vpshufd_avx(auVar2,0x55);
      auVar7 = vpmulld_avx(auVar7,auVar16);
      auVar7 = vpaddd_avx(auVar2,auVar7);
      local_e8 = local_e8 + v.values[auVar7._0_4_];
      iVar6 = __begin2.super_IndexingIterator<pbrt::detail::Hammersley2DIter>.i + 1;
      __begin2.super_IndexingIterator<pbrt::detail::Hammersley2DIter>.i = iVar6;
    }
    auVar7._8_8_ = 0;
    auVar7._0_4_ = b.pMin.super_Tuple2<pbrt::Point2,_float>.x;
    auVar7._4_4_ = b.pMin.super_Tuple2<pbrt::Point2,_float>.y;
    auVar16._8_8_ = 0;
    auVar16._0_4_ = b.pMax.super_Tuple2<pbrt::Point2,_float>.x;
    auVar16._4_4_ = b.pMax.super_Tuple2<pbrt::Point2,_float>.y;
    auVar16 = vsubps_avx(auVar16,auVar7);
    auVar7 = vmovshdup_avx(auVar16);
    sampledResult = (auVar16._0_4_ * auVar7._0_4_ * local_e8) / 100000.0;
    FVar9 = pbrt::SummedAreaTable::Integral(&sat,&b);
    s = (double)FVar9;
    if ((sampledResult != FVar9) || (NAN(sampledResult) || NAN(FVar9))) {
      local_e0.ptr_._0_4_ = 0x3a83126f;
      auVar12._0_8_ = ((double)sampledResult - s) / (double)sampledResult;
      auVar12._8_8_ = 0;
      auVar2._8_8_ = 0x7fffffffffffffff;
      auVar2._0_8_ = 0x7fffffffffffffff;
      auVar7 = vandpd_avx512vl(auVar12,auVar2);
      __begin2.super_IndexingIterator<pbrt::detail::Hammersley2DIter> =
           (IndexingIterator<pbrt::detail::Hammersley2DIter>)vmovlpd_avx(auVar7);
      args_1 = &local_e0;
      testing::internal::CmpHelperLT<double,float>
                ((internal *)&gtest_ar,"std::abs((sampledResult - s) / sampledResult)","1e-3f",
                 (double *)&__begin2,(float *)&local_e0);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_e0);
        pbrt::StringPrintf<float&,double&>
                  ((string *)&__begin2,(pbrt *)"sampled %f s %f",(char *)&sampledResult,(float *)&s,
                   (double *)args_1);
        std::operator<<((ostream *)(CONCAT44(local_e0.ptr_._4_4_,local_e0.ptr_._0_4_) + 0x10),
                        (string *)&__begin2);
        message = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/sampling_test.cpp"
                   ,0x53d,message);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        std::__cxx11::string::~string((string *)&__begin2);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_e0);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
    }
    pbrt::Array2D<double>::~Array2D(&sat.sum);
    pbrt::Array2D<float>::~Array2D(&v);
  }
  return;
}

Assistant:

TEST(SummedArea, NonCellAligned) {
    std::array<int, 2> dims[] = {{1, 6}, {6, 1}, {12, 19}, {16, 16}, {100, 300}, {49, 2}};
    RNG rng;
    for (const auto d : dims) {
        Array2D<Float> v(d[0], d[1]);

        for (int y = 0; y < v.ySize(); ++y)
            for (int x = 0; x < v.xSize(); ++x)
                v(x, y) = rng.Uniform<int>(32);

        SummedAreaTable sat(v);

        Bounds2f b({rng.Uniform<Float>(), rng.Uniform<Float>()},
                   {rng.Uniform<Float>(), rng.Uniform<Float>()});

        Float sampledSum = 0;
        int nSamples = 100000;
        for (Point2f u : Hammersley2D(nSamples)) {
            Point2f p = b.Lerp(u);
            Point2i pi(p.x * v.xSize(), p.y * v.ySize());
            sampledSum += v[pi];
        }
        Float sampledResult = sampledSum * b.Area() / nSamples;

        double s = sat.Integral(b);
        if (sampledResult != s)
            EXPECT_LT(std::abs((sampledResult - s) / sampledResult), 1e-3f)
                << StringPrintf("sampled %f s %f", sampledResult, s);
    }
}